

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O0

uint32_t PatchHandleArchipelago::inject_npc_addr_to_uuid_table(ROM *rom,RandomizerWorld *world)

{
  ItemSourceReward *this;
  bool bVar1;
  uint32_t uVar2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *this_00;
  reference ppIVar3;
  size_type sVar4;
  reference pvVar5;
  reference puVar6;
  allocator<char> local_c9;
  string local_c8;
  uint32_t local_a4;
  iterator iStack_a0;
  uint32_t addr;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  ByteArray bytes;
  uint8_t reward_id;
  ItemSourceReward *reward_source;
  ItemSource *source;
  iterator __end1;
  iterator __begin1;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> npc_reward_addresses;
  RandomizerWorld *world_local;
  ROM *rom_local;
  
  npc_reward_addresses.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)world;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  this_00 = RandomizerWorld::item_sources
                      ((RandomizerWorld *)
                       npc_reward_addresses.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  __end1 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin(this_00);
  source = (ItemSource *)std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                           (&__end1,(__normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                     *)&source), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar3 = __gnu_cxx::
              __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
              ::operator*(&__end1);
    this = (ItemSourceReward *)*ppIVar3;
    bVar1 = ItemSource::is_npc_reward((ItemSource *)this);
    if (bVar1) {
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = ItemSourceReward::reward_id(this);
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      if (sVar4 <= bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._7_1_) {
        bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                   (ulong)(bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage._7_1_ + 1),
                   (value_type_conflict5 *)
                   &bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      uVar2 = ItemSourceReward::address_in_rom(this);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                          (ulong)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
      *pvVar5 = uVar2 + 1;
    }
    __gnu_cxx::
    __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>::
    operator++(&__end1);
  }
  ByteArray::ByteArray((ByteArray *)&__range1_1);
  __end1_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  iStack_a0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  while (bVar1 = __gnu_cxx::
                 operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           (&__end1_1,&stack0xffffffffffffff60), ((bVar1 ^ 0xffU) & 1) != 0) {
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1_1);
    local_a4 = *puVar6;
    ByteArray::add_long((ByteArray *)&__range1_1,local_a4);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1_1);
  }
  ByteArray::add_long((ByteArray *)&__range1_1,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  uVar2 = md::ROM::inject_bytes
                    (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_1,
                     &local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  ByteArray::~ByteArray((ByteArray *)&__range1_1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  return uVar2;
}

Assistant:

static uint32_t inject_npc_addr_to_uuid_table(md::ROM& rom, RandomizerWorld& world)
    {
        std::vector<uint32_t> npc_reward_addresses;
        for(ItemSource* source : world.item_sources())
        {
            if(!source->is_npc_reward())
                continue;
            ItemSourceReward* reward_source = reinterpret_cast<ItemSourceReward*>(source);

            uint8_t reward_id = reward_source->reward_id();
            if(npc_reward_addresses.size() <= reward_id)
                npc_reward_addresses.resize(reward_id+1, 0xFFFFFFFF);
            npc_reward_addresses[reward_id] = reward_source->address_in_rom() + 1;
        }

        ByteArray bytes;
        for(uint32_t addr : npc_reward_addresses)
            bytes.add_long(addr);
        bytes.add_long(0xFFFFFFFF);
        return rom.inject_bytes(bytes);
    }